

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::UberMaterial::readFrom(UberMaterial *this,BinaryReader *binary)

{
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  return;
}

Assistant:

void UberMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kd);
    binary.read(map_kd);
    binary.read(ks);
    binary.read(map_ks);
    binary.read(kr);
    binary.read(map_kr);
    binary.read(kt);
    binary.read(map_kt);
    binary.read(opacity);
    binary.read(map_opacity);
    binary.read(alpha);
    binary.read(map_alpha);
    binary.read(shadowAlpha);
    binary.read(map_shadowAlpha);
    binary.read(index);
    binary.read(roughness);
    binary.read(map_roughness);
    binary.read(map_bump);
  }